

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macierz.c
# Opt level: O0

int main(void)

{
  void *__ptr;
  void *__ptr_00;
  int *piVar1;
  runnable_t *prVar2;
  double dVar3;
  int local_d0;
  int local_cc;
  int i_2;
  int i_1;
  runnable_t *new_runnable;
  my_job *new_my_job;
  int i;
  runnable_t **runArray;
  my_job **jobArray;
  thread_pool_t pool;
  int local_10;
  int columns;
  int rows;
  
  columns = 0;
  pthread_mutex_init((pthread_mutex_t *)&guard,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&cond,(pthread_condattr_t *)0x0);
  __isoc99_scanf("%d",&local_10);
  __isoc99_scanf("%d",(undefined1 *)((long)&pool.threads_idle + 0x2c));
  thread_pool_init((thread_pool_t *)&jobArray,4);
  row_sum = (int *)calloc((long)local_10,4);
  __ptr = malloc((long)(int)(local_10 * pool.threads_idle.__data.__g_signals[1]) << 3);
  __ptr_00 = malloc((long)(int)(local_10 * pool.threads_idle.__data.__g_signals[1]) * 0x18);
  for (new_my_job._4_4_ = 0;
      new_my_job._4_4_ < (int)(local_10 * pool.threads_idle.__data.__g_signals[1]);
      new_my_job._4_4_ = new_my_job._4_4_ + 1) {
    piVar1 = (int *)malloc(0xc);
    dVar3 = floor((double)new_my_job._4_4_ / (double)(int)pool.threads_idle.__data.__g_signals[1]);
    *piVar1 = (int)dVar3;
    __isoc99_scanf("%d",piVar1 + 1);
    __isoc99_scanf("%d",piVar1 + 2);
    *(int **)((long)__ptr + (long)new_my_job._4_4_ * 8) = piVar1;
    prVar2 = (runnable_t *)malloc(0x18);
    prVar2->function = runnable_function;
    prVar2->arg = piVar1;
    prVar2->argsz = 0xc;
    *(runnable_t **)((long)__ptr_00 + (long)new_my_job._4_4_ * 8) = prVar2;
    defer((thread_pool_t *)&jobArray,*prVar2);
  }
  pthread_mutex_lock((pthread_mutex_t *)&guard);
  while (count != local_10 * pool.threads_idle.__data.__g_signals[1]) {
    pthread_cond_wait((pthread_cond_t *)&cond,(pthread_mutex_t *)&guard);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&guard);
  thread_pool_destroy((thread_pool_t *)&jobArray);
  for (local_cc = 0; local_cc < local_10; local_cc = local_cc + 1) {
    printf("%d\n",(ulong)(uint)row_sum[local_cc]);
  }
  for (local_d0 = 0; local_d0 < (int)(local_10 * pool.threads_idle.__data.__g_signals[1]);
      local_d0 = local_d0 + 1) {
    free(*(void **)((long)__ptr + (long)local_d0 * 8));
    free(*(void **)((long)__ptr_00 + (long)local_d0 * 8));
  }
  free(__ptr);
  free(__ptr_00);
  free(row_sum);
  return 0;
}

Assistant:

int main() {
    pthread_mutex_init(&guard, 0);
    pthread_cond_init(&cond, 0);

    int rows, columns;
    scanf("%d", &rows);
    scanf("%d", &columns);

    thread_pool_t pool;
    thread_pool_init(&pool, NO_THREADS);

    row_sum = calloc(rows, sizeof(int));

    my_job **jobArray = malloc(rows * columns * sizeof(my_job *));
    runnable_t **runArray = malloc(rows * columns * sizeof(runnable_t));
    for (int i = 0; i < rows * columns; ++i) {
        /* Creating Job */
        my_job *new_my_job = malloc(sizeof(my_job));

        new_my_job->row = floor((double) i / (double) columns);

        scanf("%d", &new_my_job->val);
        scanf("%d", &new_my_job->sleep_time);

        jobArray[i] = new_my_job;

        /* Creating Runnable */
        runnable_t *new_runnable = malloc(sizeof(runnable_t));

        new_runnable->function = runnable_function;
        new_runnable->arg = new_my_job;
        new_runnable->argsz = sizeof(my_job);

        runArray[i] = new_runnable;

        /* Submit task to the thread pool */
        defer(&pool, *new_runnable);
    }

    pthread_mutex_lock(&guard);
    while (count != rows * columns) {
        pthread_cond_wait(&cond, &guard);
    }
    pthread_mutex_unlock(&guard);

    thread_pool_destroy(&pool);

    for (int i = 0; i < rows; ++i) {
        printf("%d\n", row_sum[i]);
    }

    for (int i = 0; i < rows * columns; ++i) {
        free(jobArray[i]);
        free(runArray[i]);
    }

    free(jobArray);
    free(runArray);
    free(row_sum);

    return 0;
}